

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall PatternBlock::normalize(PatternBlock *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  reference puVar8;
  uint local_10c;
  uintm tmp;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_100;
  const_iterator local_f8;
  const_iterator local_f0;
  uint *local_e8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  uint *local_c8;
  uint *local_c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  uint *local_a8;
  uint *local_a0;
  int local_98;
  int local_94;
  int4 i_1;
  int4 i;
  uintm tmp_1;
  int4 suboff;
  const_iterator local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  const_iterator local_70;
  uint *local_68;
  const_iterator local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator local_50;
  uint *local_48;
  uint *local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  uint *local_30;
  uint *local_28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  iterator iter2;
  iterator iter1;
  PatternBlock *this_local;
  
  if (this->nonzerosize < 1) {
    this->offset = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->maskvec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->valvec);
  }
  else {
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    __normal_iterator(&iter2);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    __normal_iterator(&local_20);
    local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&this->maskvec);
    iter2._M_current = local_28;
    local_30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 (&this->valvec);
    local_20._M_current = local_30;
    while( true ) {
      local_38._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->maskvec);
      bVar1 = __gnu_cxx::operator!=(&iter2,&local_38);
      bVar2 = false;
      if (bVar1) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&iter2);
        bVar2 = *puVar8 == 0;
      }
      if (!bVar2) break;
      local_40 = (uint *)__gnu_cxx::
                         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator++(&iter2,0);
      local_48 = (uint *)__gnu_cxx::
                         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator++(&local_20,0);
      this->offset = this->offset + 4;
    }
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->maskvec);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_50,&local_58);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_60,&iter2);
    local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                                 (&this->maskvec,local_50,local_60);
    local_78._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->valvec);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_70,&local_78);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_80,&local_20);
    _tmp_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                       (&this->valvec,local_70,local_80);
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->maskvec);
    if (!bVar2) {
      i = 0;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->maskvec,0);
      for (i_1 = *pvVar5; i_1 != 0; i_1 = (uint)i_1 >> 8) {
        i = i + 1;
      }
      i = 4 - i;
      if (i != 0) {
        this->offset = i + this->offset;
        for (local_94 = 0; uVar6 = (ulong)local_94,
            sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->maskvec),
            uVar6 < sVar7 - 1; local_94 = local_94 + 1) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->maskvec,(long)local_94);
          i_1 = *pvVar5 << ((byte)(i << 3) & 0x1f);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->maskvec,(long)(local_94 + 1));
          uVar3 = *pvVar5 >> (('\x04' - (char)i) * '\b' & 0x1fU) | i_1;
          i_1 = uVar3;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->maskvec,(long)local_94);
          *pvVar5 = uVar3;
        }
        iVar4 = i << 3;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->maskvec);
        *pvVar5 = *pvVar5 << ((byte)iVar4 & 0x1f);
        for (local_98 = 0; uVar6 = (ulong)local_98,
            sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->valvec),
            uVar6 < sVar7 - 1; local_98 = local_98 + 1) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->valvec,(long)local_98);
          i_1 = *pvVar5 << ((byte)(i << 3) & 0x1f);
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->valvec,(long)(local_98 + 1));
          uVar3 = *pvVar5 >> (('\x04' - (char)i) * '\b' & 0x1fU) | i_1;
          i_1 = uVar3;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->valvec,(long)local_98);
          *pvVar5 = uVar3;
        }
        iVar4 = i << 3;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->valvec);
        *pvVar5 = *pvVar5 << ((byte)iVar4 & 0x1f);
      }
      local_a0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   (&this->maskvec);
      iter2._M_current = local_a0;
      local_a8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   (&this->valvec);
      local_20._M_current = local_a8;
      do {
        local_b0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->maskvec)
        ;
        bVar2 = __gnu_cxx::operator!=(&iter2,&local_b0);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator--(&iter2);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator--(&local_20);
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&iter2);
      } while (*puVar8 == 0);
      local_b8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->maskvec);
      bVar2 = __gnu_cxx::operator!=(&iter2,&local_b8);
      if (bVar2) {
        local_c0 = (uint *)__gnu_cxx::
                           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator++(&iter2,0);
        local_c8 = (uint *)__gnu_cxx::
                           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator++(&local_20,0);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_d0,&iter2);
      local_e0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->maskvec);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_d8,&local_e0);
      local_e8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                                   (&this->maskvec,local_d0,local_d8);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_f0,&local_20);
      local_100._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->valvec);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_f8,&local_100);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                (&this->valvec,local_f0,local_f8);
    }
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->maskvec);
    if (bVar2) {
      this->offset = 0;
      this->nonzerosize = 0;
    }
    else {
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->maskvec);
      this->nonzerosize = (int4)(sVar7 << 2);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->maskvec);
      for (local_10c = *pvVar5; (local_10c & 0xff) == 0; local_10c = local_10c >> 8) {
        this->nonzerosize = this->nonzerosize + -1;
      }
    }
  }
  return;
}

Assistant:

void PatternBlock::normalize(void)

{
  if (nonzerosize<=0) {		// Check if alwaystrue or alwaysfalse
    offset = 0;			// in which case we don't need mask and value
    maskvec.clear();
    valvec.clear();
    return;
  }
  vector<uintm>::iterator iter1,iter2;
  
  iter1 = maskvec.begin();	// Cut zeros from beginning of mask
  iter2 = valvec.begin();
  while((iter1 != maskvec.end())&&((*iter1)==0)) {
    iter1++;
    iter2++;
    offset += sizeof(uintm);
  }
  maskvec.erase(maskvec.begin(),iter1);
  valvec.erase(valvec.begin(),iter2);

  if (!maskvec.empty()) {
    int4 suboff = 0;		// Cut off unaligned zeros from beginning of mask
    uintm tmp = maskvec[0];
    while(tmp != 0) {
      suboff += 1;
      tmp >>= 8;
    }
    suboff = sizeof(uintm)-suboff;
    if (suboff != 0) {
      offset += suboff;		// Slide up maskvec by suboff bytes
      for(int4 i=0;i<maskvec.size()-1;++i) {
	tmp = maskvec[i] << (suboff*8);
	tmp |= (maskvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	maskvec[i] = tmp;
      }
      maskvec.back() <<= suboff*8;
      for(int4 i=0;i<valvec.size()-1;++i) { // Slide up valvec by suboff bytes
	tmp = valvec[i] << (suboff*8);
	tmp |= (valvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	valvec[i] = tmp;
      }
      valvec.back() <<= suboff*8;
    }
    
    iter1 = maskvec.end();	// Cut zeros from end of mask
    iter2 = valvec.end();
    while(iter1 != maskvec.begin()) {
      --iter1;
      --iter2;
      if ((*iter1) != 0) break; // Find last non-zero
    }
    if (iter1 != maskvec.end()) {
      iter1++;			// Find first zero, in last zero chain
      iter2++;
    }
    maskvec.erase(iter1,maskvec.end());
    valvec.erase(iter2,valvec.end());
  }

  if (maskvec.empty()) {
    offset = 0;
    nonzerosize = 0;		// Always true
    return;
  }
  nonzerosize = maskvec.size() * sizeof(uintm);
  uintm tmp = maskvec.back();	// tmp must be nonzero
  while( (tmp&0xff) == 0) {
    nonzerosize -= 1;
    tmp >>= 8;
  }
}